

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfs_malloc.cc
# Opt level: O0

bool __thiscall HugetlbSysAllocator::Initialize(HugetlbSysAllocator *this)

{
  LogItem b;
  LogItem b_00;
  LogItem b_01;
  LogItem b_02;
  LogItem c;
  LogItem c_00;
  LogItem c_01;
  LogItem c_02;
  LogItem d;
  LogItem d_00;
  LogItem d_01;
  LogItem d_02;
  int iVar1;
  void *__src;
  int *piVar2;
  char *pcVar3;
  LogItem a;
  LogItem a_00;
  LogItem a_01;
  LogItem a_02;
  int64_t page_size;
  anon_union_8_4_e5b1a622_for_u_ local_1210;
  LogItem local_1208;
  SafeStrError local_11f8;
  LogItem local_11d0;
  LogItem local_11c0;
  undefined1 local_11b0 [8];
  statfs sfs;
  anon_union_8_4_e5b1a622_for_u_ local_1130;
  SafeStrError local_1128;
  LogItem local_1100;
  LogItem local_10f0;
  LogItem local_10e0;
  LogItem local_10d0;
  SafeStrError local_10c0;
  LogItem local_1098;
  LogItem local_1088;
  LogItem local_1078;
  int local_1064;
  undefined1 auStack_1060 [4];
  int hugetlb_fd;
  anon_union_8_4_e5b1a622_for_u_ local_1058;
  LogItem local_1050;
  LogItem local_1040;
  LogItem local_1030;
  int local_101c;
  char local_1018 [4];
  int pathlen;
  char path [4096];
  HugetlbSysAllocator *this_local;
  
  path._4088_8_ = this;
  local_101c = std::__cxx11::string::size();
  if (local_101c + 8U < 0x1001) {
    __src = (void *)std::__cxx11::string::data();
    memcpy(local_1018,__src,(long)local_101c);
    *(char (*) [8])(local_1018 + local_101c) = (char  [8])0x5858585858582e;
    local_1064 = mkstemp(local_1018);
    if (local_1064 == -1) {
      tcmalloc::LogItem::LogItem(&local_1078,"warning: unable to create memfs_malloc_path");
      tcmalloc::LogItem::LogItem(&local_1088,local_1018);
      piVar2 = __errno_location();
      tcmalloc::SafeStrError::SafeStrError(&local_10c0,*piVar2);
      pcVar3 = tcmalloc::SafeStrError::c_str(&local_10c0);
      tcmalloc::LogItem::LogItem(&local_1098,pcVar3);
      tcmalloc::LogItem::LogItem(&local_10d0);
      a_00._4_4_ = 0;
      a_00.tag_ = local_1078.tag_;
      b_00.u_.str = local_1088.u_.str;
      b_00.tag_ = local_1088.tag_;
      b_00._4_4_ = local_1088._4_4_;
      c_00.u_.str = local_1098.u_.str;
      c_00.tag_ = local_1098.tag_;
      c_00._4_4_ = local_1098._4_4_;
      d_00.u_.str = local_10d0.u_.str;
      d_00.tag_ = local_10d0.tag_;
      d_00._4_4_ = local_10d0._4_4_;
      a_00.u_.str = local_1078.u_.str;
      tcmalloc::Log(kLog,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/memfs_malloc.cc"
                    ,0xed,a_00,b_00,c_00,d_00);
      this_local._7_1_ = false;
    }
    else {
      iVar1 = unlink(local_1018);
      if (iVar1 == -1) {
        tcmalloc::LogItem::LogItem(&local_10e0,"fatal: error unlinking memfs_malloc_path");
        tcmalloc::LogItem::LogItem(&local_10f0,local_1018);
        piVar2 = __errno_location();
        tcmalloc::SafeStrError::SafeStrError(&local_1128,*piVar2);
        pcVar3 = tcmalloc::SafeStrError::c_str(&local_1128);
        tcmalloc::LogItem::LogItem(&local_1100,pcVar3);
        tcmalloc::LogItem::LogItem((LogItem *)(sfs.f_spare + 3));
        a_01._4_4_ = 0;
        a_01.tag_ = local_10e0.tag_;
        b_01.u_.str = local_10f0.u_.str;
        b_01.tag_ = local_10f0.tag_;
        b_01._4_4_ = local_10f0._4_4_;
        c_01.u_.str = local_1100.u_.str;
        c_01.tag_ = local_1100.tag_;
        c_01._4_4_ = local_1100._4_4_;
        d_01.u_.str = local_1130.str;
        d_01._0_8_ = sfs.f_spare[3];
        a_01.u_.str = local_10e0.u_.str;
        tcmalloc::Log(kCrash,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/memfs_malloc.cc"
                      ,0xf5,a_01,b_01,c_01,d_01);
        this_local._7_1_ = false;
      }
      else {
        iVar1 = fstatfs(local_1064,(statfs *)local_11b0);
        if (iVar1 == -1) {
          tcmalloc::LogItem::LogItem(&local_11c0,"fatal: error fstatfs of memfs_malloc_path");
          piVar2 = __errno_location();
          tcmalloc::SafeStrError::SafeStrError(&local_11f8,*piVar2);
          pcVar3 = tcmalloc::SafeStrError::c_str(&local_11f8);
          tcmalloc::LogItem::LogItem(&local_11d0,pcVar3);
          tcmalloc::LogItem::LogItem(&local_1208);
          tcmalloc::LogItem::LogItem((LogItem *)&page_size);
          a_02._4_4_ = 0;
          a_02.tag_ = local_11c0.tag_;
          b_02.u_.str = local_11d0.u_.str;
          b_02.tag_ = local_11d0.tag_;
          b_02._4_4_ = local_11d0._4_4_;
          c_02.u_.str = local_1208.u_.str;
          c_02.tag_ = local_1208.tag_;
          c_02._4_4_ = local_1208._4_4_;
          d_02.u_.str = local_1210.str;
          d_02._0_8_ = page_size;
          a_02.u_.str = local_11c0.u_.str;
          tcmalloc::Log(kCrash,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/memfs_malloc.cc"
                        ,0xfe,a_02,b_02,c_02,d_02);
          this_local._7_1_ = false;
        }
        else {
          this->hugetlb_fd_ = local_1064;
          this->big_page_size_ = sfs.f_type;
          this->failed_ = false;
          this_local._7_1_ = true;
        }
      }
    }
  }
  else {
    tcmalloc::LogItem::LogItem(&local_1030,"XX fatal: memfs_malloc_path too long");
    tcmalloc::LogItem::LogItem(&local_1040);
    tcmalloc::LogItem::LogItem(&local_1050);
    tcmalloc::LogItem::LogItem((LogItem *)auStack_1060);
    a._4_4_ = 0;
    a.tag_ = local_1030.tag_;
    b.u_.str = local_1040.u_.str;
    b.tag_ = local_1040.tag_;
    b._4_4_ = local_1040._4_4_;
    c.u_.str = local_1050.u_.str;
    c.tag_ = local_1050.tag_;
    c._4_4_ = local_1050._4_4_;
    d.u_.str = local_1058.str;
    d.tag_ = (Tag)auStack_1060;
    d._4_4_ = hugetlb_fd;
    a.u_.str = local_1030.u_.str;
    tcmalloc::Log(kCrash,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/memfs_malloc.cc"
                  ,0xe5,a,b,c,d);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HugetlbSysAllocator::Initialize() {
  char path[PATH_MAX];
  const int pathlen = FLAGS_memfs_malloc_path.size();
  if (pathlen + 8 > sizeof(path)) {
    Log(kCrash, __FILE__, __LINE__, "XX fatal: memfs_malloc_path too long");
    return false;
  }
  memcpy(path, FLAGS_memfs_malloc_path.data(), pathlen);
  memcpy(path + pathlen, ".XXXXXX", 8);  // Also copies terminating \0

  int hugetlb_fd = mkstemp(path);
  if (hugetlb_fd == -1) {
    Log(kLog, __FILE__, __LINE__,
        "warning: unable to create memfs_malloc_path",
        path, tcmalloc::SafeStrError(errno).c_str());
    return false;
  }

  // Cleanup memory on process exit
  if (unlink(path) == -1) {
    Log(kCrash, __FILE__, __LINE__,
        "fatal: error unlinking memfs_malloc_path", path,
        tcmalloc::SafeStrError(errno).c_str());
    return false;
  }

  // Use fstatfs to figure out the default page size for memfs
  struct statfs sfs;
  if (fstatfs(hugetlb_fd, &sfs) == -1) {
    Log(kCrash, __FILE__, __LINE__,
        "fatal: error fstatfs of memfs_malloc_path",
        tcmalloc::SafeStrError(errno).c_str());
    return false;
  }
  int64_t page_size = sfs.f_bsize;

  hugetlb_fd_ = hugetlb_fd;
  big_page_size_ = page_size;
  failed_ = false;
  return true;
}